

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O3

wasm_importtype_t *
wasm_importtype_new(wasm_name_t *module,wasm_name_t *name,wasm_externtype_t *type)

{
  wasm_importtype_t *this;
  _Head_base<0UL,_wabt::interp::ExternType_*,_false> local_c0;
  long *local_b8;
  long local_b0;
  long local_a8 [2];
  long *local_98;
  long local_90;
  long local_88 [2];
  undefined1 local_78 [32];
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  _Head_base<0UL,_wabt::interp::ExternType_*,_false> local_38;
  
  this = (wasm_importtype_t *)operator_new(0x70);
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,module->data,module->data + module->size);
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,name->data,name->data + name->size);
  (*((type->I)._M_t.
     super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
     ._M_t.
     super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
     .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl)->_vptr_ExternType[2])
            (&local_c0);
  local_78._0_8_ = local_78 + 0x10;
  std::__cxx11::string::_M_construct<char*>((string *)local_78,local_98,local_90 + (long)local_98);
  local_58._M_p = (pointer)&local_48;
  std::__cxx11::string::_M_construct<char*>((string *)&local_58,local_b8,local_b0 + (long)local_b8);
  local_38._M_head_impl = local_c0._M_head_impl;
  local_c0._M_head_impl = (ExternType *)0x0;
  wasm_importtype_t::wasm_importtype_t(this,(ImportType *)local_78);
  if ((_Head_base<0UL,_wabt::interp::ExternType_*,_false>)local_38._M_head_impl !=
      (_Head_base<0UL,_wabt::interp::ExternType_*,_false>)0x0) {
    (*(local_38._M_head_impl)->_vptr_ExternType[1])();
  }
  local_38._M_head_impl = (ExternType *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  if (local_c0._M_head_impl != (ExternType *)0x0) {
    (*(local_c0._M_head_impl)->_vptr_ExternType[1])();
  }
  local_c0._M_head_impl = (ExternType *)0x0;
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  return this;
}

Assistant:

own wasm_importtype_t* wasm_importtype_new(own wasm_name_t* module,
                                           own wasm_name_t* name,
                                           own wasm_externtype_t* type) {
  return new wasm_importtype_t{
      ImportType{ToString(module), ToString(name), type->I->Clone()}};
}